

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O3

optional<SignetTxs> *
SignetTxs::Create(optional<SignetTxs> *__return_storage_ptr__,CBlock *block,CScript *challenge)

{
  uchar *puVar1;
  element_type *peVar2;
  pointer pCVar3;
  char *pcVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  vector<uint256,_std::allocator<uint256>_> hashes;
  bool bVar8;
  pointer pCVar9;
  bool bVar10;
  uint uVar11;
  undefined8 uVar12;
  uint uVar13;
  size_type *psVar14;
  pointer pbVar15;
  pointer psVar16;
  long lVar17;
  ulong uVar18;
  CScript *pCVar19;
  ulong uVar20;
  CScript *this;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  VectorWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signet_solution;
  CMutableTransaction tx_to_spend;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  SpanReader v;
  uint256 signet_merkle;
  CMutableTransaction modified_cb;
  CMutableTransaction tx_spending;
  _Storage<SignetTxs,_false> *p_Var21;
  CBlock *pCVar22;
  opcodetype in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  char *local_238;
  long lStack_230;
  long local_228;
  undefined1 local_220 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_208;
  undefined8 local_1f0;
  vector<uint256,_std::allocator<uint256>_> local_1e8;
  undefined1 local_1c8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_1b0 [4];
  vector<CTxIn,_std::allocator<CTxIn>_> local_148;
  vector<CTxOut,_std::allocator<CTxOut>_> local_130 [4];
  undefined1 local_c8 [8];
  pointer pbStack_c0;
  pointer local_b8;
  undefined1 local_a8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> vStack_90;
  undefined1 local_70 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_220);
  local_1f0._0_4_ = 0;
  local_1f0._4_4_ = 0;
  local_1c8[0x10] = '\0';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = '\0';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1c8._0_8_ = (char *)0x0;
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_4_ = 0xffffffff;
  CScript::CScript((CScript *)local_70,OP_0);
  local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)local_220,(COutPoint *)local_1c8,
             (CScript *)local_70,(int *)local_a8);
  if (0x1c < local_58.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_70._0_8_);
  }
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_208,(int *)local_1c8,challenge);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_70);
  local_40._0_4_ = 0;
  local_40._4_4_ = 0;
  local_1c8._16_8_ = 0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1c8._0_8_ = (char *)0x0;
  local_1c8._8_8_ = 0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_4_ = 0xffffffff;
  local_a8._16_8_ = 0;
  vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8._0_8_ = (char *)0x0;
  local_a8._8_8_ = 0;
  local_c8 = (undefined1  [8])((ulong)(uint)local_c8._4_4_ << 0x20);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            ((vector<CTxIn,std::allocator<CTxIn>> *)local_70,(COutPoint *)local_1c8,
             (CScript *)local_a8,(int *)local_c8);
  if (0x1c < vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
  CScript::CScript((CScript *)local_1c8,OP_RETURN);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_58,(int *)local_a8,(CScript *)local_1c8
            );
  if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_1c8._0_8_);
  }
  psVar16 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar16 ==
      (block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
    super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>.
    _M_engaged = false;
  }
  else {
    CMutableTransaction::CMutableTransaction
              ((CMutableTransaction *)local_a8,
               (psVar16->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    pCVar9 = vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar16 = (block->vtx).
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (psVar16 ==
        (block->vtx).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00aabcb2:
      (__return_storage_ptr__->super__Optional_base<SignetTxs,_false,_false>)._M_payload.
      super__Optional_payload<SignetTxs,_true,_false,_false>.super__Optional_payload_base<SignetTxs>
      ._M_engaged = false;
    }
    else {
      peVar2 = (psVar16->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar3;
      if (lVar17 == 0) goto LAB_00aabcb2;
      lVar17 = (lVar17 >> 3) * -0x3333333333333333;
      psVar14 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
      uVar18 = 0xffffffff;
      uVar20 = 0;
      do {
        if (((((0x42 < *psVar14) &&
              (pcVar4 = *(char **)&((CScriptBase *)(psVar14 + -7))->_union, *pcVar4 == 'j')) &&
             (pcVar4[1] == '$')) && ((pcVar4[2] == -0x56 && (pcVar4[3] == '!')))) &&
           ((pcVar4[4] == -0x57 && (pcVar4[5] == -0x13)))) {
          uVar18 = uVar20 & 0xffffffff;
        }
        uVar20 = uVar20 + 1;
        psVar14 = psVar14 + 10;
      } while (lVar17 + (ulong)(lVar17 == 0) != uVar20);
      if ((int)uVar18 == -1) goto LAB_00aabcb2;
      uVar20 = (ulong)(int)uVar18;
      uVar18 = ((long)vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar18 < uVar20 || uVar18 - uVar20 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar12 = std::__throw_out_of_range_fmt
                             (
                             "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             );
          if (local_c8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
          }
          if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_) {
            free((void *)local_1c8._0_8_);
          }
          if (local_238 != (char *)0x0) {
            operator_delete(local_238,local_228 - (long)local_238);
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_90);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a8);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_58);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_70);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_208);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_220);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar12);
          }
        }
        goto LAB_00aac2ce;
      }
      this = &vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20].scriptPubKey;
      local_238 = (char *)0x0;
      lStack_230 = 0;
      bVar8 = false;
      local_228 = 0;
      local_1c8._16_8_ = 0;
      avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8._0_8_ = (char *)0x0;
      local_1c8._8_8_ = 0;
      pCVar19 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
      uVar11 = vStack_90.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20].scriptPubKey.super_CScriptBase._size;
      local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pCVar19;
      if (uVar11 < 0x1d) {
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this;
      }
      local_b8 = (pointer)0x0;
      local_c8 = (undefined1  [8])0x0;
      pbStack_c0 = (pointer)0x0;
      while( true ) {
        uVar13 = uVar11 - 0x1d;
        if (uVar11 < 0x1d) {
          uVar13 = uVar11;
        }
        if (uVar11 < 0x1d) {
          pCVar19 = this;
        }
        bVar10 = GetScriptOp((const_iterator *)&local_1e8,
                             (uchar *)((long)&(pCVar19->super_CScriptBase)._union +
                                      (long)(int)uVar13),(opcodetype *)&stack0xfffffffffffffdb8,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
        if (!bVar10) break;
        if ((undefined1  [8])pbStack_c0 == local_c8) {
          CScript::operator<<((CScript *)local_1c8,in_stack_fffffffffffffdb8);
        }
        else {
          pbVar15 = pbStack_c0;
          if ((4 < (ulong)((long)pbStack_c0 - (long)local_c8) && !bVar8) &&
             (*(undefined4 *)local_c8 == 0xa2dac7ec)) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_238,lStack_230,
                       (pointer)((long)local_c8 + 4));
            pbVar15 = (pointer)((long)local_c8 + 4);
            bVar8 = true;
            if (pbVar15 != pbStack_c0) {
              pbStack_c0 = pbVar15;
            }
          }
          b._M_extent._M_extent_value = (long)pbVar15 - (long)local_c8;
          b._M_ptr = (pointer)local_c8;
          CScript::operator<<((CScript *)local_1c8,b);
        }
        uVar11 = pCVar9[uVar20].scriptPubKey.super_CScriptBase._size;
        pCVar19 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
      }
      if (bVar8) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&this->super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
      }
      p_Var21 = (_Storage<SignetTxs,_false> *)__return_storage_ptr__;
      if (local_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
      }
      if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_) {
        free((void *)local_1c8._0_8_);
      }
      pCVar22 = block;
      if (bVar8) {
        local_1c8._8_8_ = lStack_230 - (long)local_238;
        local_1c8._0_8_ = local_238;
        Unserialize<SpanReader,28u,unsigned_char>
                  ((SpanReader *)local_1c8,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_70._0_8_ + 0x28));
        VectorFormatter<DefaultFormatter>::
        Unser<SpanReader,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((VectorFormatter<DefaultFormatter> *)local_c8,(SpanReader *)local_1c8,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(local_70._0_8_ + 0x50));
        if (local_1c8._8_8_ == 0) goto LAB_00aabdfd;
        *(_Storage<SignetTxs,_false> *)((long)__return_storage_ptr__ + 0x100) =
             (_Storage<SignetTxs,_false>)0x0;
      }
      else {
LAB_00aabdfd:
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<uint256,_std::allocator<uint256>_>::resize
                  (&local_1e8,
                   (long)(block->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(block->vtx).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        CMutableTransaction::GetHash((Txid *)local_1c8,(CMutableTransaction *)local_a8);
        *(undefined8 *)
         (((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             local_1c8._16_8_;
        *(pointer *)
         (((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)
         ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems =
             local_1c8._0_8_;
        *(undefined8 *)
         (((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + 8) =
             local_1c8._8_8_;
        psVar16 = (block->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0x10 < (ulong)((long)(block->vtx).
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar16)) {
          uVar18 = 1;
          lVar17 = 0x10;
          do {
            lVar5 = *(long *)((long)&(psVar16->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar17);
            uVar12 = *(undefined8 *)(lVar5 + 0x39);
            uVar6 = *(undefined8 *)(lVar5 + 0x41);
            uVar7 = *(undefined8 *)(lVar5 + 0x51);
            puVar1 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar17 * 2 + 0x10;
            *(undefined8 *)puVar1 = *(undefined8 *)(lVar5 + 0x49);
            *(undefined8 *)(puVar1 + 8) = uVar7;
            puVar1 = ((local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar17 * 2;
            *(undefined8 *)puVar1 = uVar12;
            *(undefined8 *)(puVar1 + 8) = uVar6;
            uVar18 = uVar18 + 1;
            psVar16 = (block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0x10;
          } while (uVar18 < (ulong)((long)(block->vtx).
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar16
                                   >> 4));
        }
        local_1c8._0_8_ =
             local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1c8._8_8_ =
             local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1c8._16_8_ =
             local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)pCVar22;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)p_Var21;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._0_4_ = in_stack_fffffffffffffdb8;
        hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ = in_stack_fffffffffffffdbc;
        ComputeMerkleRoot((uint256 *)local_c8,hashes,(bool *)local_1c8);
        if ((char *)local_1c8._0_8_ != (char *)0x0) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
        }
        if (local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8._0_4_ = (block->super_CBlockHeader).nVersion;
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)local_1c8,(void *)0x4,
                            (size_t)psVar16);
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)block + 4,(void *)0x20,
                            (size_t)psVar16);
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)local_c8,(void *)0x20,
                            (size_t)psVar16);
        local_1c8._0_4_ = (block->super_CBlockHeader).nTime;
        VectorWriter::write((VectorWriter *)&stack0xfffffffffffffdb8,(int)local_1c8,(void *)0x4,
                            (size_t)psVar16);
        b_00._M_extent._M_extent_value =
             (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start;
        b_00._M_ptr = (pointer)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                               _M_impl.super__Vector_impl_data._M_start;
        CScript::operator<<((CScript *)(local_220._0_8_ + 0x28),b_00);
        CMutableTransaction::GetHash((Txid *)local_1c8,(CMutableTransaction *)local_220);
        *(undefined8 *)(local_70._0_8_ + 0x10) = local_1c8._16_8_;
        *(pointer *)(local_70._0_8_ + 0x18) =
             avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(undefined8 *)local_70._0_8_ = local_1c8._0_8_;
        *(undefined8 *)(local_70._0_8_ + 8) = local_1c8._8_8_;
        *(undefined4 *)(local_70._0_8_ + 0x20) = 0;
        SignetTxs<CMutableTransaction,CMutableTransaction>
                  ((SignetTxs *)local_1c8,(CMutableTransaction *)local_220,
                   (CMutableTransaction *)local_70);
        std::_Optional_payload_base<SignetTxs>::_Storage<SignetTxs,_false>::_Storage<SignetTxs>
                  ((_Storage<SignetTxs,_false> *)__return_storage_ptr__,local_1c8);
        *(_Storage<SignetTxs,_false> *)((long)__return_storage_ptr__ + 0x100) =
             (_Storage<SignetTxs,_false>)0x1;
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_130);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_148);
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
        std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
        if ((CScript *)
            local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start != (CScript *)0x0) {
          operator_delete(local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_238 != (char *)0x0) {
        operator_delete(local_238,local_228 - (long)local_238);
      }
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&vStack_90);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a8);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_58);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_70);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_208);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_220);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (optional<SignetTxs> *)(_Storage<SignetTxs,_false> *)__return_storage_ptr__;
  }
LAB_00aac2ce:
  __stack_chk_fail();
}

Assistant:

std::optional<SignetTxs> SignetTxs::Create(const CBlock& block, const CScript& challenge)
{
    CMutableTransaction tx_to_spend;
    tx_to_spend.version = 0;
    tx_to_spend.nLockTime = 0;
    tx_to_spend.vin.emplace_back(COutPoint(), CScript(OP_0), 0);
    tx_to_spend.vout.emplace_back(0, challenge);

    CMutableTransaction tx_spending;
    tx_spending.version = 0;
    tx_spending.nLockTime = 0;
    tx_spending.vin.emplace_back(COutPoint(), CScript(), 0);
    tx_spending.vout.emplace_back(0, CScript(OP_RETURN));

    // can't fill any other fields before extracting signet
    // responses from block coinbase tx

    // find and delete signet signature
    if (block.vtx.empty()) return std::nullopt; // no coinbase tx in block; invalid
    CMutableTransaction modified_cb(*block.vtx.at(0));

    const int cidx = GetWitnessCommitmentIndex(block);
    if (cidx == NO_WITNESS_COMMITMENT) {
        return std::nullopt; // require a witness commitment
    }

    CScript& witness_commitment = modified_cb.vout.at(cidx).scriptPubKey;

    std::vector<uint8_t> signet_solution;
    if (!FetchAndClearCommitmentSection(SIGNET_HEADER, witness_commitment, signet_solution)) {
        // no signet solution -- allow this to support OP_TRUE as trivial block challenge
    } else {
        try {
            SpanReader v{signet_solution};
            v >> tx_spending.vin[0].scriptSig;
            v >> tx_spending.vin[0].scriptWitness.stack;
            if (!v.empty()) return std::nullopt; // extraneous data encountered
        } catch (const std::exception&) {
            return std::nullopt; // parsing error
        }
    }
    uint256 signet_merkle = ComputeModifiedMerkleRoot(modified_cb, block);

    std::vector<uint8_t> block_data;
    VectorWriter writer{block_data, 0};
    writer << block.nVersion;
    writer << block.hashPrevBlock;
    writer << signet_merkle;
    writer << block.nTime;
    tx_to_spend.vin[0].scriptSig << block_data;
    tx_spending.vin[0].prevout = COutPoint(tx_to_spend.GetHash(), 0);

    return SignetTxs{tx_to_spend, tx_spending};
}